

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::CwiseMultiply::dim_forward(CwiseMultiply *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *ds;
  invalid_argument *this_00;
  uint *puVar4;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  __off_t __length;
  __off_t __length_00;
  Dim *in_RDI;
  ostringstream s;
  Dim *in_stack_fffffffffffffda8;
  Dim *in_stack_fffffffffffffdb0;
  ostringstream *this_01;
  Dim *this_02;
  string local_228 [48];
  ostringstream local_1f8 [380];
  Dim local_7c [3];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  this_02 = in_RDI;
  local_10 = in_RDX;
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 != 2) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes-common.cc"
                  ,0x2a6,"virtual Dim cnn::CwiseMultiply::dim_forward(const vector<Dim> &) const");
  }
  pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  Dim::truncate(this_02,(char *)pvVar3,__length);
  Dim::single_batch(in_stack_fffffffffffffdb0);
  pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
  Dim::truncate(local_7c,(char *)pvVar3,__length_00);
  Dim::single_batch(in_stack_fffffffffffffdb0);
  bVar1 = cnn::operator!=(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (!bVar1) {
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
    puVar4 = std::max<unsigned_int>(&pvVar3->bd,&this_02->bd);
    this_02->bd = *puVar4;
    return in_RDI;
  }
  this_01 = local_1f8;
  std::__cxx11::ostringstream::ostringstream(this_01);
  ds = std::operator<<((ostream *)this_01,"Mismatched input dimensions in CwiseMultiply: ");
  cnn::operator<<((ostream *)this_02,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)ds);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(this_00,local_228);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim CwiseMultiply::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 2);
  Dim d = xs[0].truncate();
  if (d.single_batch() != xs[1].truncate().single_batch()) {
    ostringstream s; s << "Mismatched input dimensions in CwiseMultiply: " << xs;
    throw std::invalid_argument(s.str());
  }
  d.bd = max(xs[1].bd, d.bd);
  return d;
}